

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ReusableStringStream::ReusableStringStream(ReusableStringStream *this)

{
  StringStreams *pSVar1;
  size_t sVar2;
  reference this_00;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ReusableStringStream *this_local;
  
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable()
  ;
  sVar2 = StringStreams::add(pSVar1);
  this->m_index = sVar2;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getMutable()
  ;
  this_00 = std::
            vector<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&pSVar1->m_streams,this->m_index);
  pbVar3 = Detail::
           unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get(this_00);
  this->m_oss = (ostream *)pbVar3;
  return;
}

Assistant:

ReusableStringStream::ReusableStringStream()
    :   m_index( Singleton<StringStreams>::getMutable().add() ),
        m_oss( Singleton<StringStreams>::getMutable().m_streams[m_index].get() )
    {}